

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::verifyGetTexParameter
          (TextureCubeMapArrayGetterCalls *this,GLenum pname,GLint expected_value)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  TestError *this_00;
  char *local_348;
  MessageBuilder local_340;
  char *local_1c0 [3];
  MessageBuilder local_1a8;
  int local_24;
  long lStack_20;
  GLint int_value;
  Functions *gl;
  GLint expected_value_local;
  GLenum pname_local;
  TextureCubeMapArrayGetterCalls *this_local;
  
  gl._0_4_ = expected_value;
  gl._4_4_ = pname;
  _expected_value_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  (**(code **)(lStack_20 + 0xad0))(0x9009,gl._4_4_,&local_24);
  iVar1 = (**(code **)(lStack_20 + 0x800))();
  if (iVar1 != 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [46])"glGetTexParameteriv() call failed for pname: ");
    local_1c0[0] = getStringForGetTexParameterPname(gl._4_4_);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"glGetTexLevelParameteriv() call failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
               ,0x1e4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_24 != (GLint)gl) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_340,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_340,(char (*) [42])"glGetTexParameteriv() called for pname: [");
    local_348 = getStringForGetTexParameterPname(gl._4_4_);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_348);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [33])"] returned an invalid value of:[");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_24);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])"], expected:[");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&gl);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    this->m_test_passed = '\0';
  }
  return;
}

Assistant:

void TextureCubeMapArrayGetterCalls::verifyGetTexParameter(glw::GLenum pname, glw::GLint expected_value)
{
	/* Retrieve ES function pointers */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint int_value = 0;

	/* Retrieve property value(s) using glGetTexParameteriv() */
	gl.getTexParameteriv(GL_TEXTURE_CUBE_MAP_ARRAY, pname, &int_value);

	if (gl.getError() != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetTexParameteriv() call failed for pname: " << getStringForGetTexParameterPname(pname)
						   << tcu::TestLog::EndMessage;

		TCU_FAIL("glGetTexLevelParameteriv() call failed");
	}

	if (int_value != expected_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetTexParameteriv() called for pname: "
													   "["
						   << getStringForGetTexParameterPname(pname) << "]"
																		 " returned an invalid value of:"
																		 "["
						   << int_value << "]"
										   ", expected:"
										   "["
						   << expected_value << "]" << tcu::TestLog::EndMessage;

		m_test_passed = false;
	}
}